

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

UBool udata_cleanup(void)

{
  bool bVar1;
  int local_c;
  int32_t i;
  
  if (gCommonDataCache != (UHashtable *)0x0) {
    uhash_close_63(gCommonDataCache);
    gCommonDataCache = (UHashtable *)0x0;
  }
  icu_63::UInitOnce::reset(&gCommonDataCacheInitOnce);
  local_c = 0;
  while( true ) {
    bVar1 = false;
    if (local_c < 10) {
      bVar1 = gCommonICUDataArray[local_c] != (UDataMemory *)0x0;
    }
    if (!bVar1) break;
    udata_close_63(gCommonICUDataArray[local_c]);
    gCommonICUDataArray[local_c] = (UDataMemory *)0x0;
    local_c = local_c + 1;
  }
  std::__atomic_base<int>::operator=(&gHaveTriedToLoadCommonData.super___atomic_base<int>,0);
  return '\x01';
}

Assistant:

static UBool U_CALLCONV
udata_cleanup(void)
{
    int32_t i;

    if (gCommonDataCache) {             /* Delete the cache of user data mappings.  */
        uhash_close(gCommonDataCache);  /*   Table owns the contents, and will delete them. */
        gCommonDataCache = NULL;        /*   Cleanup is not thread safe.                */
    }
    gCommonDataCacheInitOnce.reset();

    for (i = 0; i < UPRV_LENGTHOF(gCommonICUDataArray) && gCommonICUDataArray[i] != NULL; ++i) {
        udata_close(gCommonICUDataArray[i]);
        gCommonICUDataArray[i] = NULL;
    }
    gHaveTriedToLoadCommonData = 0;

    return TRUE;                   /* Everything was cleaned up */
}